

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O3

qsizetype indexOf_helper<QStringView>
                    (QStringList *that,QStringView needle,qsizetype from,CaseSensitivity cs)

{
  ulong uVar1;
  int iVar2;
  P _a;
  ulong uVar3;
  qsizetype *pqVar4;
  QStringView rhs;
  
  uVar1 = (that->d).size;
  uVar3 = from;
  if (from < 0) {
    uVar3 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar3 = 0;
    }
  }
  if (uVar3 < uVar1) {
    pqVar4 = &(that->d).ptr[uVar3].d.size;
    do {
      rhs.m_data = (char16_t *)pqVar4[-1];
      rhs.m_size = *pqVar4;
      iVar2 = QtPrivate::compareStrings(needle,rhs,cs);
      if (iVar2 == 0) {
        return uVar3;
      }
      uVar3 = uVar3 + 1;
      pqVar4 = pqVar4 + 3;
    } while (uVar1 != uVar3);
  }
  return -1;
}

Assistant:

qsizetype indexOf_helper(const QStringList &that, String needle, qsizetype from,
                         Qt::CaseSensitivity cs)
{
    if (from < 0) // Historical behavior
        from = qMax(from + that.size(), 0);

    if (from >= that.size())
        return -1;

    for (qsizetype i = from; i < that.size(); ++i) {
        if (needle.compare(that.at(i), cs) == 0)
            return i;
    }
    return -1;
}